

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean rloc(level *lev,monst *mtmp,boolean suppress_impossible)

{
  char cVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int trycount;
  int y;
  int x;
  boolean suppress_impossible_local;
  monst *mtmp_local;
  level *lev_local;
  
  if (mtmp == u.usteed) {
    tele((char *)0x0);
    lev_local._7_1_ = '\x01';
  }
  else {
    if (((*(uint *)&mtmp->field_0x60 >> 0x1d & 1) != 0) && (mtmp->mx != '\0')) {
      bVar2 = In_W_tower(lev,(int)u.ux,(int)u.uy);
      if (bVar2 == '\0') {
        cVar3 = (lev->upstair).sx;
        cVar1 = (lev->upstair).sy;
      }
      else if ((lev->dnladder).sx == '\0') {
        cVar3 = (lev->upladder).sx;
        cVar1 = (lev->upladder).sy;
      }
      else {
        cVar3 = (lev->dnladder).sx;
        cVar1 = (lev->dnladder).sy;
      }
      trycount = (int)cVar3;
      local_2c = (int)cVar1;
      bVar2 = goodpos(lev,trycount,local_2c,mtmp,0);
      if (bVar2 != '\0') {
LAB_002fa2b2:
        rloc_to(mtmp,lev,trycount,local_2c);
        return '\x01';
      }
    }
    local_30 = 0;
    do {
      iVar4 = rn2(0x4d);
      trycount = iVar4 + 2;
      local_2c = rn2(0x15);
      if (local_30 < 500) {
        cVar3 = rloc_pos_ok(lev,trycount,local_2c,mtmp);
      }
      else {
        cVar3 = goodpos(lev,trycount,local_2c,mtmp,0);
      }
      if (cVar3 != '\0') goto LAB_002fa2b2;
      local_30 = local_30 + 1;
    } while (local_30 < 1000);
    for (trycount = 2; trycount < 0x4f; trycount = trycount + 1) {
      for (local_2c = 0; local_2c < 0x15; local_2c = local_2c + 1) {
        bVar2 = goodpos(lev,trycount,local_2c,mtmp,0);
        if (bVar2 != '\0') goto LAB_002fa2b2;
      }
    }
    if (suppress_impossible == '\0') {
      warning("rloc(): couldn\'t relocate monster");
    }
    lev_local._7_1_ = '\0';
  }
  return lev_local._7_1_;
}

Assistant:

boolean rloc(struct level *lev,
	     struct monst *mtmp, /* mx==0 implies migrating monster arrival */
	     boolean suppress_impossible)
{
	int x, y, trycount;

	if (mtmp == u.usteed) {
	    tele(NULL);
	    return TRUE;
	}

	if (mtmp->iswiz && mtmp->mx) {	/* Wizard, not just arriving */
	    if (!In_W_tower(lev, u.ux, u.uy))
		x = lev->upstair.sx,  y = lev->upstair.sy;
	    else if (!lev->dnladder.sx)	/* bottom level of tower */
		x = lev->upladder.sx,  y = lev->upladder.sy;
	    else
		x = lev->dnladder.sx,  y = lev->dnladder.sy;
	    /* if the wiz teleports away to heal, try the up staircase,
	       to block the player's escaping before he's healed
	       (deliberately use `goodpos' rather than `rloc_pos_ok' here) */
	    if (goodpos(lev, x, y, mtmp, 0))
		goto found_xy;
	}

	trycount = 0;
	do {
	    x = rn1(COLNO-3,2);
	    y = rn2(ROWNO);
	    if ((trycount < 500) ? rloc_pos_ok(lev, x, y, mtmp)
				 : goodpos(lev, x, y, mtmp, 0))
		goto found_xy;
	} while (++trycount < 1000);

	/* last ditch attempt to find a good place */
	for (x = 2; x < COLNO - 1; x++)
	    for (y = 0; y < ROWNO; y++)
		if (goodpos(lev, x, y, mtmp, 0))
		    goto found_xy;

	/* level either full of monsters or somehow faulty */
	if (!suppress_impossible)
	    warning("rloc(): couldn't relocate monster");
	return FALSE;

 found_xy:
	rloc_to(mtmp, lev, x, y);
	return TRUE;
}